

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

string * __thiscall Patch::get_json_abi_cxx11_(string *__return_storage_ptr__,Patch *this)

{
  Node *this_00;
  stringstream result;
  Point local_1a8;
  Point local_1a0;
  stringstream local_198 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = this->root;
  if (this_00 != (Node *)0x0) {
    Point::Point(&local_1a0);
    Point::Point(&local_1a8);
    Node::write_json(this_00,(stringstream *)local_198,local_1a0,local_1a8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string Patch::get_json() const {
  std::stringstream result;
  if (root) root->write_json(result, Point(), Point());
  return result.str();
}